

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLTAKURI_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000358;
  double *in_stack_00000360;
  double *in_stack_00000368;
  double *in_stack_00000370;
  int in_stack_0000037c;
  int in_stack_00000380;
  int *in_stack_00000390;
  int *in_stack_00000398;
  int *in_stack_000003a0;
  
  TVar1 = TA_CDLTAKURI(in_stack_00000380,in_stack_0000037c,in_stack_00000370,in_stack_00000368,
                       in_stack_00000360,in_stack_00000358,in_stack_00000390,in_stack_00000398,
                       in_stack_000003a0);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLTAKURI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLTAKURI(
/* Generated */                   startIdx,
/* Generated */                   endIdx,
/* Generated */                   params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                   params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                   params->in[0].data.inPrice.low, /* inLow */
/* Generated */                   params->in[0].data.inPrice.close, /* inClose */
/* Generated */                   outBegIdx, 
/* Generated */                   outNBElement, 
/* Generated */                   params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }